

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.cc
# Opt level: O2

vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_> * __thiscall
rcg::Interface::getDevices
          (vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
           *__return_storage_ptr__,Interface *this,uint64_t timeout)

{
  pointer pwVar1;
  PTLUpdateInterfaceList p_Var2;
  PTLOpenInterface p_Var3;
  Interface *pIVar4;
  __type _Var5;
  int __val;
  GC_ERROR GVar6;
  void *pvVar7;
  string *__lhs;
  Device *this_00;
  GenTLException *pGVar8;
  uint uVar9;
  ulong uVar10;
  size_t i;
  long lVar11;
  pthread_mutex_t *__mutex;
  allocator local_209;
  pthread_mutex_t *local_208;
  shared_ptr<const_rcg::GenTLWrapper> *local_200;
  Interface *local_1f8;
  vector<std::shared_ptr<rcg::Device>,std::allocator<std::shared_ptr<rcg::Device>>> *local_1f0;
  void **local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  vector<std::weak_ptr<rcg::Device>,std::allocator<std::weak_ptr<rcg::Device>>> *local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_> current;
  uint32_t n;
  size_t size;
  shared_ptr<rcg::Device> p;
  
  __mutex = (pthread_mutex_t *)&this->mtx;
  std::mutex::lock((mutex *)&__mutex->__data);
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f0 = (vector<std::shared_ptr<rcg::Device>,std::allocator<std::shared_ptr<rcg::Device>>> *)
              __return_storage_ptr__;
  if (this->ifh != (void *)0x0) {
    local_1e8 = &this->ifh;
    current.
    super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    current.
    super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    current.
    super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1c0 = (vector<std::weak_ptr<rcg::Device>,std::allocator<std::weak_ptr<rcg::Device>>> *)
                &this->dlist;
    lVar11 = 0;
    local_208 = __mutex;
    local_1f8 = this;
    for (uVar10 = 0; pIVar4 = local_1f8,
        pwVar1 = (local_1f8->dlist).
                 super__Vector_base<std::weak_ptr<rcg::Device>,_std::allocator<std::weak_ptr<rcg::Device>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar10 < (ulong)((long)(local_1f8->dlist).
                               super__Vector_base<std::weak_ptr<rcg::Device>,_std::allocator<std::weak_ptr<rcg::Device>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pwVar1 >> 4);
        uVar10 = uVar10 + 1) {
      std::__shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&p.super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>,
                 (long)&(pwVar1->super___weak_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
                 lVar11);
      if (p.super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>::
        push_back(&current,(value_type *)
                           &p.super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&p.super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      lVar11 = lVar11 + 0x10;
    }
    __val = (*((local_1f8->gentl).
               super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              IFUpdateDeviceList)(local_1f8->ifh,(bool8_t *)0x0,timeout);
    local_200 = &pIVar4->gentl;
    if (__val == -0x3ee) {
      p_Var2 = ((pIVar4->gentl).
                super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               TLUpdateInterfaceList;
      pvVar7 = System::getHandle((pIVar4->parent).
                                 super___shared_ptr<rcg::System,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ;
      GVar6 = (*p_Var2)(pvVar7,(bool8_t *)0x0,10);
      if (GVar6 != 0) {
        pGVar8 = (GenTLException *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string
                  ((string *)&local_1e0,"Interface::getDevices() (recovery 1) ",
                   (allocator *)&local_1b8);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,
                       &local_1e0,&local_1f8->id);
        GenTLException::GenTLException(pGVar8,(string *)&p,local_200);
        __cxa_throw(pGVar8,&GenTLException::typeinfo,GenTLException::~GenTLException);
      }
      p_Var3 = ((pIVar4->gentl).
                super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               TLOpenInterface;
      pvVar7 = System::getHandle((pIVar4->parent).
                                 super___shared_ptr<rcg::System,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ;
      GVar6 = (*p_Var3)(pvVar7,(pIVar4->id)._M_dataplus._M_p,local_1e8);
      if (GVar6 != 0) {
        pGVar8 = (GenTLException *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string
                  ((string *)&local_1e0,"Interface::getDevices() (recovery 2) ",
                   (allocator *)&local_1b8);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,
                       &local_1e0,&local_1f8->id);
        GenTLException::GenTLException(pGVar8,(string *)&p,local_200);
        __cxa_throw(pGVar8,&GenTLException::typeinfo,GenTLException::~GenTLException);
      }
      __val = (*((local_200->super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr)->IFUpdateDeviceList)(*local_1e8,(bool8_t *)0x0,timeout);
    }
    if (__val != 0) {
      pGVar8 = (GenTLException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string((string *)&size,"Interface::getDevices() (1) ",&local_209);
      std::operator+(&local_1b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&size,
                     &local_1f8->id);
      std::operator+(&local_1e0,&local_1b8," ");
      std::__cxx11::to_string((string *)&n,__val);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,
                     &local_1e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&n);
      GenTLException::GenTLException(pGVar8,(string *)&p,local_200);
      __cxa_throw(pGVar8,&GenTLException::typeinfo,GenTLException::~GenTLException);
    }
    n = 0;
    GVar6 = (*((local_200->super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->IFGetNumDevices)(*local_1e8,&n);
    if (GVar6 != 0) {
      pGVar8 = (GenTLException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&local_1e0,"Interface::getDevices() (2) ",(allocator *)&local_1b8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,
                     &local_1e0,&local_1f8->id);
      GenTLException::GenTLException(pGVar8,(string *)&p,local_200);
      __cxa_throw(pGVar8,&GenTLException::typeinfo,GenTLException::~GenTLException);
    }
    for (uVar9 = 0; uVar9 < n; uVar9 = uVar9 + 1) {
      memset(&p,0,0x100);
      size = 0x100;
      GVar6 = (*((local_200->super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr)->IFGetDeviceID)(*local_1e8,uVar9,(char *)&p,&size);
      if (GVar6 != 0) {
        pGVar8 = (GenTLException *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string((string *)&local_1b8,"Interface::getDevices() (3) ",&local_209)
        ;
        std::operator+(&local_1e0,&local_1b8,&local_1f8->id);
        GenTLException::GenTLException(pGVar8,&local_1e0,local_200);
        __cxa_throw(pGVar8,&GenTLException::typeinfo,GenTLException::~GenTLException);
      }
      std::__cxx11::string::string((string *)&local_1e0,(char *)&p,(allocator *)&local_1b8);
      lVar11 = 0;
      for (uVar10 = 0;
          uVar10 < (ulong)((long)current.
                                 super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)current.
                                 super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 4);
          uVar10 = uVar10 + 1) {
        __lhs = Device::getID_abi_cxx11_
                          (*(Device **)
                            ((long)&((current.
                                      super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>).
                                    _M_ptr + lVar11));
        _Var5 = std::operator==(__lhs,&local_1e0);
        if (_Var5) goto LAB_0010c5f7;
        lVar11 = lVar11 + 0x10;
      }
      uVar10 = 0xffffffff;
LAB_0010c5f7:
      std::__cxx11::string::~string((string *)&local_1e0);
      if ((int)uVar10 < 0) {
        this_00 = (Device *)operator_new(0x130);
        std::__shared_ptr<rcg::Interface,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<rcg::Interface,void>
                  ((__shared_ptr<rcg::Interface,(__gnu_cxx::_Lock_policy)2> *)&local_1b8,
                   (__weak_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2> *)local_1f8);
        Device::Device(this_00,(shared_ptr<rcg::Interface> *)&local_1b8,local_200,(char *)&p);
        std::__shared_ptr<rcg::Device,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<rcg::Device,void>
                  ((__shared_ptr<rcg::Device,(__gnu_cxx::_Lock_policy)2> *)&local_1e0,this_00);
        std::vector<std::shared_ptr<rcg::Device>,std::allocator<std::shared_ptr<rcg::Device>>>::
        emplace_back<std::shared_ptr<rcg::Device>>(local_1f0,(shared_ptr<rcg::Device> *)&local_1e0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1e0._M_string_length);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1b8._M_string_length);
      }
      else {
        std::vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>::
        push_back((vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                   *)local_1f0,
                  current.
                  super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + (uVar10 & 0xffffffff));
      }
    }
    std::vector<std::weak_ptr<rcg::Device>,_std::allocator<std::weak_ptr<rcg::Device>_>_>::clear
              ((vector<std::weak_ptr<rcg::Device>,_std::allocator<std::weak_ptr<rcg::Device>_>_> *)
               local_1c0);
    __mutex = local_208;
    lVar11 = 0;
    for (uVar10 = 0; uVar10 < (ulong)((long)*(pointer *)(local_1f0 + 8) - *(long *)local_1f0 >> 4);
        uVar10 = uVar10 + 1) {
      std::__weak_ptr<rcg::Device,(__gnu_cxx::_Lock_policy)2>::__weak_ptr<rcg::Device,void>
                ((__weak_ptr<rcg::Device,(__gnu_cxx::_Lock_policy)2> *)&p,
                 (__shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2> *)
                 (*(long *)local_1f0 + lVar11));
      std::vector<std::weak_ptr<rcg::Device>,std::allocator<std::weak_ptr<rcg::Device>>>::
      emplace_back<std::weak_ptr<rcg::Device>>(local_1c0,(weak_ptr<rcg::Device> *)&p);
      std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                 &p.super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      lVar11 = lVar11 + 0x10;
    }
    std::vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>::
    ~vector(&current);
  }
  pthread_mutex_unlock(__mutex);
  return (vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_> *)
         local_1f0;
}

Assistant:

std::vector<std::shared_ptr<Device> > Interface::getDevices(uint64_t timeout)
{
  std::lock_guard<std::mutex> lock(mtx);

  std::vector<std::shared_ptr<Device> > ret;

  if (ifh != 0)
  {
    // get list of previously requested devices that are still in use

    std::vector<std::shared_ptr<Device> > current;

    for (size_t i=0; i<dlist.size(); i++)
    {
      std::shared_ptr<Device> p=dlist[i].lock();
      if (p)
      {
        current.push_back(p);
      }
    }

    // update available interfaces

    GenTL::GC_ERROR err=gentl->IFUpdateDeviceList(ifh, 0, timeout);

    if (err == GenTL::GC_ERR_INVALID_HANDLE)
    {
      // the interface handle is invalid, try to reopen the interface

      if (gentl->TLUpdateInterfaceList(parent->getHandle(), 0, 10) != GenTL::GC_ERR_SUCCESS)
      {
        throw GenTLException(std::string("Interface::getDevices() (recovery 1) ")+id, gentl);
      }

      if (gentl->TLOpenInterface(parent->getHandle(), id.c_str(), &ifh) != GenTL::GC_ERR_SUCCESS)
      {
        throw GenTLException(std::string("Interface::getDevices() (recovery 2) ")+id, gentl);
      }

      // try to repeat discovery of devices

      err=gentl->IFUpdateDeviceList(ifh, 0, timeout);
    }

    if (err != GenTL::GC_ERR_SUCCESS)
    {
      throw GenTLException(std::string("Interface::getDevices() (1) ")+id+" "+std::to_string(err), gentl);
    }

    // create list of devices, using either existing devices or
    // instantiating new ones

    uint32_t n=0;
    if (gentl->IFGetNumDevices(ifh, &n) != GenTL::GC_ERR_SUCCESS)
    {
      throw GenTLException(std::string("Interface::getDevices() (2) ")+id, gentl);
    }

    for (uint32_t i=0; i<n; i++)
    {
      char tmp[256]="";
      size_t size=sizeof(tmp);

      if (gentl->IFGetDeviceID(ifh, i, tmp, &size) != GenTL::GC_ERR_SUCCESS)
      {
        throw GenTLException(std::string("Interface::getDevices() (3) ")+id, gentl);
      }

      int k=find(current, tmp);

      if (k >= 0)
      {
        ret.push_back(current[static_cast<size_t>(k)]);
      }
      else
      {
        ret.push_back(std::shared_ptr<Device>(new Device(shared_from_this(), gentl, tmp)));
      }
    }

    // update internal list of devices for reusage on next call

    dlist.clear();
    for (size_t i=0; i<ret.size(); i++)
    {
      dlist.push_back(ret[i]);
    }
  }

  return ret;
}